

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

void __thiscall
dg::vr::GraphBuilder::buildSwitch(GraphBuilder *this,SwitchInst *swtch,VRLocation *last)

{
  mapped_type pVVar1;
  VRLocation *this_00;
  bool bVar2;
  VRLocation *this_01;
  mapped_type *ppVVar3;
  sockaddr *psVar4;
  socklen_t __len;
  CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock> *in_RCX;
  VRLocation *in_RDX;
  long in_RDI;
  VRLocation *first;
  VRLocation *first_1;
  VRLocation *padding;
  CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock> *it;
  CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>
  __end2;
  CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>
  __begin2;
  iterator_range<llvm::SwitchInst::CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>_>
  *__range2;
  CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>
  *in_stack_ffffffffffffff08;
  VRCodeGraph *in_stack_ffffffffffffff10;
  int __fd;
  Value *in_stack_ffffffffffffff18;
  VRAssumeEqual *in_stack_ffffffffffffff20;
  SwitchInst *in_stack_ffffffffffffff40;
  key_type *in_stack_ffffffffffffff48;
  VRLocation *in_stack_ffffffffffffff50;
  CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock> local_50;
  iterator_range<llvm::SwitchInst::CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>_>
  local_40;
  iterator_range<llvm::SwitchInst::CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>_>
  *local_20;
  VRLocation *local_18;
  
  local_18 = in_RDX;
  llvm::SwitchInst::cases(in_stack_ffffffffffffff40);
  local_20 = &local_40;
  local_50 = (CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>
              )llvm::
               iterator_range<llvm::SwitchInst::CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>_>
               ::begin(local_20);
  llvm::
  iterator_range<llvm::SwitchInst::CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>_>
  ::end(local_20);
  while( true ) {
    __len = (socklen_t)in_RCX;
    bVar2 = llvm::
            iterator_facade_base<llvm::SwitchInst::CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>,_std::random_access_iterator_tag,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>,_long,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_*,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_&>
            ::operator!=((iterator_facade_base<llvm::SwitchInst::CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>,_std::random_access_iterator_tag,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>,_long,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_*,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_&>
                          *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (!bVar2) break;
    in_RCX = llvm::SwitchInst::
             CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>
             ::operator*((CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>
                          *)&local_50);
    this_01 = VRCodeGraph::newVRLocation(in_stack_ffffffffffffff10);
    this_00 = local_18;
    psVar4 = (sockaddr *)operator_new(0x20);
    llvm::SwitchInst::getCondition((SwitchInst *)0x1bce5d);
    llvm::SwitchInst::
    CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>::
    getCaseValue((CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>
                  *)0x1bce6f);
    VRAssumeEqual::VRAssumeEqual
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (Value *)in_stack_ffffffffffffff10);
    VRLocation::connect(this_00,(int)this_01,psVar4,(socklen_t)in_RCX);
    in_stack_ffffffffffffff48 = (key_type *)(in_RDI + 0x10);
    llvm::SwitchInst::
    CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>::
    getCaseSuccessor((CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>
                      *)in_stack_ffffffffffffff10);
    ppVVar3 = std::
              map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
              ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                            *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    pVVar1 = *ppVVar3;
    psVar4 = (sockaddr *)operator_new(0x10);
    VRNoop::VRNoop((VRNoop *)in_stack_ffffffffffffff10);
    VRLocation::connect(this_01,(int)pVVar1,psVar4,(socklen_t)in_RCX);
    llvm::
    iterator_facade_base<llvm::SwitchInst::CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>,_std::random_access_iterator_tag,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>,_long,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_*,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_&>
    ::operator++((iterator_facade_base<llvm::SwitchInst::CaseIteratorImpl<llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_>,_std::random_access_iterator_tag,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>,_long,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_*,_const_llvm::SwitchInst::CaseHandleImpl<const_llvm::SwitchInst,_const_llvm::ConstantInt,_const_llvm::BasicBlock>_&>
                  *)0x1bcf21);
    in_stack_ffffffffffffff50 = this_01;
  }
  llvm::SwitchInst::getDefaultDest((SwitchInst *)0x1bcf40);
  ppVVar3 = std::
            map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
            ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                          *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __fd = (int)*ppVVar3;
  psVar4 = (sockaddr *)operator_new(0x10);
  VRNoop::VRNoop((VRNoop *)local_18);
  VRLocation::connect(local_18,__fd,psVar4,__len);
  return;
}

Assistant:

void GraphBuilder::buildSwitch(const llvm::SwitchInst *swtch,
                               VRLocation &last) {
    for (auto &it : swtch->cases()) {
        VRLocation &padding = codeGraph.newVRLocation();

        last.connect(padding, new VRAssumeEqual(swtch->getCondition(),
                                                it.getCaseValue()));

        assert(fronts.find(it.getCaseSuccessor()) != fronts.end());
        VRLocation &first = *fronts[it.getCaseSuccessor()];

        padding.connect(first, new VRNoop());
    }

    assert(fronts.find(swtch->getDefaultDest()) != fronts.end());
    VRLocation &first = *fronts[swtch->getDefaultDest()];
    last.connect(first, new VRNoop());
}